

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_arc_to(plutovg_path_t *path,float rx,float ry,float angle,_Bool large_arc_flag,
                        _Bool sweep_flag,float x,float y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_c8;
  float local_c4;
  float cp1y;
  float cp1x;
  float cp2y;
  float cp2x;
  float y3;
  float x3;
  float t;
  float th_end;
  float th_start;
  int i;
  int segments;
  float th_arc;
  float th2;
  float th1;
  float cy1;
  float cx1;
  float scale;
  float scale_sq;
  float d;
  float dy1;
  float dx1;
  float y2;
  float x2;
  float y1;
  float x1;
  float radius;
  float dydy;
  float dxdx;
  float ryry;
  float rxrx;
  plutovg_matrix_t matrix;
  float dy;
  float dx;
  float current_y;
  float current_x;
  float y_local;
  float x_local;
  _Bool sweep_flag_local;
  float fStack_18;
  _Bool large_arc_flag_local;
  float angle_local;
  float ry_local;
  float rx_local;
  plutovg_path_t *path_local;
  
  current_y = y;
  current_x = x;
  y_local._2_1_ = sweep_flag;
  y_local._3_1_ = large_arc_flag;
  x_local = angle;
  fStack_18 = ry;
  angle_local = rx;
  _ry_local = path;
  plutovg_path_get_current_point(path,&dx,&dy);
  if ((((angle_local == 0.0) && (!NAN(angle_local))) || ((fStack_18 == 0.0 && (!NAN(fStack_18)))))
     || ((((dx == current_x && (!NAN(dx) && !NAN(current_x))) && (dy == current_y)) &&
         (!NAN(dy) && !NAN(current_y))))) {
    plutovg_path_line_to(_ry_local,current_x,current_y);
  }
  else {
    if (angle_local < 0.0) {
      angle_local = -angle_local;
    }
    if (fStack_18 < 0.0) {
      fStack_18 = -fStack_18;
    }
    matrix.f = (dx - current_x) * 0.5;
    matrix.e = (dy - current_y) * 0.5;
    plutovg_matrix_init_rotate((plutovg_matrix_t *)&ryry,-x_local);
    plutovg_matrix_map((plutovg_matrix_t *)&ryry,matrix.f,matrix.e,&matrix.f,&matrix.e);
    dxdx = angle_local * angle_local;
    dydy = fStack_18 * fStack_18;
    radius = matrix.f * matrix.f;
    x1 = matrix.e * matrix.e;
    y1 = radius / dxdx + x1 / dydy;
    if (1.0 < y1) {
      fVar2 = sqrtf(y1);
      angle_local = fVar2 * angle_local;
      fVar2 = sqrtf(y1);
      fStack_18 = fVar2 * fStack_18;
    }
    plutovg_matrix_init_scale((plutovg_matrix_t *)&ryry,1.0 / angle_local,1.0 / fStack_18);
    plutovg_matrix_rotate((plutovg_matrix_t *)&ryry,-x_local);
    plutovg_matrix_map((plutovg_matrix_t *)&ryry,dx,dy,&x2,&y2);
    plutovg_matrix_map((plutovg_matrix_t *)&ryry,current_x,current_y,&dx1,&dy1);
    d = dx1 - x2;
    scale_sq = dy1 - y2;
    scale = d * d + scale_sq * scale_sq;
    cx1 = 1.0 / scale - 0.25;
    if (cx1 < 0.0) {
      cx1 = 0.0;
    }
    cy1 = sqrtf(cx1);
    if ((y_local._2_1_ & 1) == (y_local._3_1_ & 1)) {
      cy1 = -cy1;
    }
    d = cy1 * d;
    scale_sq = cy1 * scale_sq;
    th1 = (x2 + dx1) * 0.5 + -scale_sq;
    th2 = (y2 + dy1) * 0.5 + d;
    th_arc = atan2f(y2 - th2,x2 - th1);
    segments = (int)atan2f(dy1 - th2,dx1 - th1);
    i = (int)((float)segments - th_arc);
    if ((0.0 <= (float)i) || ((y_local._2_1_ & 1) == 0)) {
      if ((0.0 < (float)i) && ((y_local._2_1_ & 1) == 0)) {
        i = (int)((float)i - 6.2831855);
      }
    }
    else {
      i = (int)((float)i + 6.2831855);
    }
    plutovg_matrix_init_rotate((plutovg_matrix_t *)&ryry,x_local);
    plutovg_matrix_scale((plutovg_matrix_t *)&ryry,angle_local,fStack_18);
    fVar2 = ceilf(ABS((float)i / 1.5717964));
    th_start = (float)(int)fVar2;
    for (th_end = 0.0; (int)th_end < (int)th_start; th_end = (float)((int)th_end + 1)) {
      t = th_arc + ((float)(int)th_end * (float)i) / (float)(int)th_start;
      x3 = th_arc + ((float)((int)th_end + 1) * (float)i) / (float)(int)th_start;
      fVar2 = tanf((x3 - t) * 0.25);
      y3 = fVar2 * 1.3333334;
      fVar2 = cosf(x3);
      cp2x = fVar2 + th1;
      fVar2 = sinf(x3);
      fVar5 = y3;
      fVar4 = cp2x;
      cp2y = fVar2 + th2;
      fVar3 = sinf(x3);
      fVar1 = y3;
      fVar2 = cp2y;
      cp1x = fVar5 * fVar3 + fVar4;
      fVar4 = cosf(x3);
      cp1y = -fVar1 * fVar4 + fVar2;
      fVar4 = cosf(t);
      fVar2 = y3;
      fVar5 = sinf(t);
      local_c4 = -fVar2 * fVar5 + fVar4;
      fVar4 = sinf(t);
      fVar2 = y3;
      fVar5 = cosf(t);
      local_c4 = th1 + local_c4;
      local_c8 = th2 + fVar2 * fVar5 + fVar4;
      plutovg_matrix_map((plutovg_matrix_t *)&ryry,local_c4,local_c8,&local_c4,&local_c8);
      plutovg_matrix_map((plutovg_matrix_t *)&ryry,cp1x,cp1y,&cp1x,&cp1y);
      plutovg_matrix_map((plutovg_matrix_t *)&ryry,cp2x,cp2y,&cp2x,&cp2y);
      plutovg_path_cubic_to(_ry_local,local_c4,local_c8,cp1x,cp1y,cp2x,cp2y);
    }
  }
  return;
}

Assistant:

void plutovg_path_arc_to(plutovg_path_t* path, float rx, float ry, float angle, bool large_arc_flag, bool sweep_flag, float x, float y)
{
    float current_x, current_y;
    plutovg_path_get_current_point(path, &current_x, &current_y);
    if(rx == 0.f || ry == 0.f || (current_x == x && current_y == y)) {
        plutovg_path_line_to(path, x, y);
        return;
    }

    if(rx < 0.f) rx = -rx;
    if(ry < 0.f) ry = -ry;

    float dx = (current_x - x) * 0.5f;
    float dy = (current_y - y) * 0.5f;

    plutovg_matrix_t matrix;
    plutovg_matrix_init_rotate(&matrix, -angle);
    plutovg_matrix_map(&matrix, dx, dy, &dx, &dy);

    float rxrx = rx * rx;
    float ryry = ry * ry;
    float dxdx = dx * dx;
    float dydy = dy * dy;
    float radius = dxdx / rxrx + dydy / ryry;
    if(radius > 1.f) {
        rx *= sqrtf(radius);
        ry *= sqrtf(radius);
    }

    plutovg_matrix_init_scale(&matrix, 1.f / rx, 1.f / ry);
    plutovg_matrix_rotate(&matrix, -angle);

    float x1, y1;
    float x2, y2;
    plutovg_matrix_map(&matrix, current_x, current_y, &x1, &y1);
    plutovg_matrix_map(&matrix, x, y, &x2, &y2);

    float dx1 = x2 - x1;
    float dy1 = y2 - y1;
    float d = dx1 * dx1 + dy1 * dy1;
    float scale_sq = 1.f / d - 0.25f;
    if(scale_sq < 0.f) scale_sq = 0.f;
    float scale = sqrtf(scale_sq);
    if(sweep_flag == large_arc_flag)
        scale = -scale;
    dx1 *= scale;
    dy1 *= scale;

    float cx1 = 0.5f * (x1 + x2) - dy1;
    float cy1 = 0.5f * (y1 + y2) + dx1;

    float th1 = atan2f(y1 - cy1, x1 - cx1);
    float th2 = atan2f(y2 - cy1, x2 - cx1);
    float th_arc = th2 - th1;
    if(th_arc < 0.f && sweep_flag)
        th_arc += PLUTOVG_TWO_PI;
    else if(th_arc > 0.f && !sweep_flag)
        th_arc -= PLUTOVG_TWO_PI;
    plutovg_matrix_init_rotate(&matrix, angle);
    plutovg_matrix_scale(&matrix, rx, ry);
    int segments = (int)(ceilf(fabsf(th_arc / (PLUTOVG_HALF_PI + 0.001f))));
    for(int i = 0; i < segments; i++) {
        float th_start = th1 + i * th_arc / segments;
        float th_end = th1 + (i + 1) * th_arc / segments;
        float t = (8.f / 6.f) * tanf(0.25f * (th_end - th_start));

        float x3 = cosf(th_end) + cx1;
        float y3 = sinf(th_end) + cy1;

        float cp2x = x3 + t * sinf(th_end);
        float cp2y = y3 - t * cosf(th_end);

        float cp1x = cosf(th_start) - t * sinf(th_start);
        float cp1y = sinf(th_start) + t * cosf(th_start);

        cp1x += cx1;
        cp1y += cy1;

        plutovg_matrix_map(&matrix, cp1x, cp1y, &cp1x, &cp1y);
        plutovg_matrix_map(&matrix, cp2x, cp2y, &cp2x, &cp2y);
        plutovg_matrix_map(&matrix, x3, y3, &x3, &y3);

        plutovg_path_cubic_to(path, cp1x, cp1y, cp2x, cp2y, x3, y3);
    }
}